

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Soccer.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_a7eae::Player::Player
          (Player *this,
          vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
          *others,vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
                  *allplayers,Ball *ball,bool isTeamA,int id)

{
  OpenSteer::SimpleVehicle::SimpleVehicle(&this->super_SimpleVehicle);
  (this->super_SimpleVehicle).super_SimpleVehicle_3.
  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
  super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace.
  _vptr_AbstractLocalSpace = (_func_int **)&PTR__Player_00177250;
  std::vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>::
  vector(&this->m_others,others);
  std::vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>::
  vector(&this->m_AllPlayers,allplayers);
  this->m_Ball = ball;
  this->b_ImTeamA = isTeamA;
  this->m_MyID = id;
  (this->m_home).x = 0.0;
  (this->m_home).y = 0.0;
  (this->m_home).z = 0.0;
  reset(this);
  return;
}

Assistant:

Player (std::vector<Player*> others, std::vector<Player*> allplayers, Ball* ball, bool isTeamA, int id) : m_others(others), m_AllPlayers(allplayers), m_Ball(ball), b_ImTeamA(isTeamA), m_MyID(id) {reset ();}